

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

bool Js::JavascriptLibrary::InitializeGeneratorFunctionConstructor
               (DynamicObject *generatorFunctionConstructor,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  undefined8 in_RAX;
  uint uVar2;
  JavascriptString *pJVar1;
  ulong uVar3;
  
  uVar2 = (uint)((ulong)in_RAX >> 0x20);
  DeferredTypeHandlerBase::Convert(typeHandler,generatorFunctionConstructor,mode,3,0);
  this = (((generatorFunctionConstructor->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  uVar3 = (ulong)uVar2 << 0x20;
  (*(generatorFunctionConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (generatorFunctionConstructor,0xd1,&DAT_1000000000001,2,0,0,uVar3);
  uVar3 = uVar3 & 0xffffffff00000000;
  (*(generatorFunctionConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (generatorFunctionConstructor,0x124,
             (this->super_JavascriptLibraryBase).generatorFunctionPrototype.ptr,0,0,0,uVar3);
  pJVar1 = CreateStringFromCppLiteral<18ul>(this,(char16 (*) [18])0xf9cf40);
  (*(generatorFunctionConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (generatorFunctionConstructor,0x106,pJVar1,2,0,0,uVar3 & 0xffffffff00000000);
  DynamicObject::SetHasNoEnumerableProperties(generatorFunctionConstructor,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeGeneratorFunctionConstructor(DynamicObject* generatorFunctionConstructor, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(generatorFunctionConstructor, mode, 3);
        JavascriptLibrary* library = generatorFunctionConstructor->GetLibrary();

        library->AddMember(generatorFunctionConstructor, PropertyIds::length, TaggedInt::ToVarUnchecked(1), PropertyConfigurable);
        library->AddMember(generatorFunctionConstructor, PropertyIds::prototype, library->generatorFunctionPrototype, PropertyNone);
        library->AddMember(generatorFunctionConstructor, PropertyIds::name, library->CreateStringFromCppLiteral(_u("GeneratorFunction")), PropertyConfigurable);

        generatorFunctionConstructor->SetHasNoEnumerableProperties(true);

        return true;
    }